

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableFill(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  Table *this_01;
  allocator local_99;
  string local_98;
  Ptr local_78;
  size_t local_60;
  Enum local_58;
  u32 local_54;
  Ref RStack_50;
  uint dst;
  Ref value;
  uint size;
  undefined1 local_38 [8];
  Ptr table;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  table.root_index_ = (Index)out_trap;
  this_00 = Instance::tables(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)local_38,pSVar1,(Ref)pvVar3->index);
  value.index._4_4_ = Pop<unsigned_int>(this);
  RStack_50 = Pop<wabt::interp::Ref>(this);
  local_54 = Pop<unsigned_int>(this);
  this_01 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_38);
  local_60 = RStack_50.index;
  local_58 = (Enum)Table::Fill(this_01,this->store_,local_54,RStack_50,value.index._4_4_);
  bVar2 = Failed((Result)local_58);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"out of bounds table access: table.fill out of bounds",&local_99)
    ;
    Trap::New(&local_78,pSVar1,&local_98,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)table.root_index_,&local_78)
    ;
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoTableFill(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  auto size = Pop<u32>();
  auto value = Pop<Ref>();
  auto dst = Pop<u32>();
  TRAP_IF(Failed(table->Fill(store_, dst, value, size)),
          "out of bounds table access: table.fill out of bounds");
  return RunResult::Ok;
}